

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
duckdb::LogicalCreate::Deserialize(Deserializer *deserializer)

{
  LogicalCreate *in_RSI;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> in_RDI;
  unique_ptr<duckdb::LogicalCreate,_std::default_delete<duckdb::LogicalCreate>,_true> result;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> info;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *this;
  char *in_stack_ffffffffffffffb8;
  field_id_t in_stack_ffffffffffffffc6;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
  in_stack_ffffffffffffffc8;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
  *in_stack_ffffffffffffffd8;
  ClientContext *in_stack_ffffffffffffffe0;
  LogicalOperatorType in_stack_ffffffffffffffef;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)
             in_stack_ffffffffffffffc8.
             super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
             super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl,
             in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8);
  operator_new(0x78);
  Deserializer::Get<duckdb::LogicalOperatorType>((Deserializer *)0xad3736);
  Deserializer::Get<duckdb::ClientContext&>((Deserializer *)0xad3746);
  this = (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
         &stack0xffffffffffffffc8;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::unique_ptr
            (this,(unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                  in_stack_ffffffffffffff88);
  LogicalCreate(in_RSI,in_stack_ffffffffffffffef,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8
               );
  unique_ptr<duckdb::LogicalCreate,std::default_delete<duckdb::LogicalCreate>,true>::
  unique_ptr<std::default_delete<duckdb::LogicalCreate>,void>
            ((unique_ptr<duckdb::LogicalCreate,_std::default_delete<duckdb::LogicalCreate>,_true> *)
             this,in_stack_ffffffffffffff88);
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             0xad379c);
  unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
  unique_ptr<duckdb::LogicalCreate,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)this,(unique_ptr<duckdb::LogicalCreate,_std::default_delete<duckdb::LogicalCreate>_>
                      *)in_stack_ffffffffffffff88);
  unique_ptr<duckdb::LogicalCreate,_std::default_delete<duckdb::LogicalCreate>,_true>::~unique_ptr
            ((unique_ptr<duckdb::LogicalCreate,_std::default_delete<duckdb::LogicalCreate>,_true> *)
             0xad37b5);
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             0xad37bf);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> LogicalCreate::Deserialize(Deserializer &deserializer) {
	auto info = deserializer.ReadPropertyWithDefault<unique_ptr<CreateInfo>>(200, "info");
	auto result = duckdb::unique_ptr<LogicalCreate>(new LogicalCreate(deserializer.Get<LogicalOperatorType>(), deserializer.Get<ClientContext &>(), std::move(info)));
	return std::move(result);
}